

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Asn1.cpp
# Opt level: O0

String * axl::cry::getAsn1StringString(ASN1_STRING *string)

{
  BIO *bp;
  BUF_MEM *this;
  ASN1_STRING *in_RSI;
  String *in_RDI;
  BUF_MEM *mem;
  Bio bio;
  Bio *in_stack_ffffffffffffffb0;
  Handle *p;
  Handle local_18 [8];
  ASN1_STRING *local_10;
  
  p = local_18;
  local_10 = in_RSI;
  Bio::Bio((Bio *)0x150a5a);
  Bio::createMem(in_stack_ffffffffffffffb0);
  bp = (BIO *)sl::Handle::operator_cast_to_bio_st_(local_18);
  ASN1_STRING_print(bp,local_10);
  this = Bio::getBufMem((Bio *)bp);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)this,(C *)p,(size_t)in_RDI);
  Bio::~Bio((Bio *)0x150ac3);
  return in_RDI;
}

Assistant:

sl::String
getAsn1StringString(const ASN1_STRING* string) {
	Bio bio;
	bio.createMem();
	ASN1_STRING_print(bio, string);

	BUF_MEM* mem = bio.getBufMem();
	return sl::String(mem->data, mem->length);
}